

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD3Loader.cpp
# Opt level: O1

void __thiscall
Assimp::MD3Importer::InternReadFile
          (MD3Importer *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  char *__s;
  string *psVar1;
  uint uVar2;
  uint uVar3;
  undefined4 uVar4;
  Header *pHVar5;
  size_type sVar6;
  bool bVar7;
  int iVar8;
  uint uVar9;
  ai_uint32 aVar10;
  undefined4 extraout_var;
  aiMesh **__s_00;
  aiMaterial **__s_01;
  aiMesh *paVar11;
  size_t sVar12;
  Logger *pLVar13;
  aiMaterial *this_00;
  long *plVar14;
  ulong *puVar15;
  aiFace *paVar16;
  aiVector3D *paVar17;
  uint *puVar18;
  aiNode *paVar19;
  aiNode **ppaVar20;
  long *plVar21;
  runtime_error *prVar22;
  long *plVar23;
  aiFace *paVar24;
  _func_int **pp_Var25;
  iterator dit;
  ulong uVar26;
  long lVar27;
  uchar *__s_02;
  Surface *pcSurf;
  char *texture_name;
  float *pfVar28;
  MD3Importer *pMVar29;
  long lVar30;
  aiMatrix4x4 *paVar31;
  _List_iterator<Assimp::Q3Shader::SkinData::TextureEntry> __it;
  _List_node_base *p_Var32;
  ShaderDataBlock *pSVar33;
  undefined1 *puVar34;
  char *pcVar35;
  _List_node_base *p_Var36;
  float fVar37;
  float __x;
  float fVar38;
  aiColor3D clr;
  string convertedPath;
  int iMode;
  int no_alpha;
  ShaderData shaders;
  SkinData skins;
  string _texture_name;
  vector<unsigned_char,_std::allocator<unsigned_char>_> mBuffer2;
  aiString name;
  aiString szString;
  float *local_9e0;
  uint local_9cc;
  undefined8 local_9a4;
  undefined4 local_99c;
  ulong local_998;
  ulong local_990;
  ShaderDataBlock *local_988;
  char *local_980;
  Logger *local_978;
  string local_970;
  undefined4 local_94c;
  long *local_948;
  long local_940;
  long local_938;
  long lStack_930;
  _List_base<Assimp::Q3Shader::ShaderDataBlock,_std::allocator<Assimp::Q3Shader::ShaderDataBlock>_>
  local_928;
  _List_base<Assimp::Q3Shader::SkinData::TextureEntry,_std::allocator<Assimp::Q3Shader::SkinData::TextureEntry>_>
  local_910;
  uchar *local_8f8;
  char *local_8f0;
  char *local_8e8;
  long local_8e0;
  long *local_8d8;
  long local_8d0;
  long local_8c8;
  long lStack_8c0;
  char *local_8b8;
  undefined8 local_8b0;
  char local_8a8;
  undefined7 uStack_8a7;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_898;
  ulong local_880;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_878;
  char *local_870;
  ulong local_868;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_860;
  undefined1 local_840 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_830 [6];
  MD3Importer local_7d0 [2];
  undefined1 local_438 [20];
  undefined1 uStack_424;
  undefined1 auStack_423 [1011];
  
  psVar1 = &this->mFile;
  std::__cxx11::string::_M_assign((string *)psVar1);
  this->mScene = pScene;
  this->mIOHandler = pIOHandler;
  std::__cxx11::string::find_last_of((char *)psVar1,0x6ca6ba,0xffffffffffffffff);
  std::__cxx11::string::substr((ulong)local_840,(ulong)psVar1);
  std::__cxx11::string::operator=((string *)&this->filename,(string *)local_840);
  std::__cxx11::string::substr((ulong)local_438,(ulong)psVar1);
  std::__cxx11::string::operator=((string *)&this->path,(string *)local_438);
  if ((undefined1 *)CONCAT44(local_438._4_4_,local_438._0_4_) != local_438 + 0x10) {
    operator_delete((undefined1 *)CONCAT44(local_438._4_4_,local_438._0_4_),
                    CONCAT44(_uStack_424,local_438._16_4_) + 1);
  }
  if ((undefined1 *)local_840._0_8_ != local_840 + 0x10) {
    operator_delete((void *)local_840._0_8_,local_830[0]._M_allocated_capacity + 1);
  }
  if ((this->filename)._M_string_length != 0) {
    pcVar35 = (this->filename)._M_dataplus._M_p;
    do {
      iVar8 = tolower((int)*pcVar35);
      *pcVar35 = (char)iVar8;
      pcVar35 = pcVar35 + 1;
    } while (pcVar35 != (this->filename)._M_dataplus._M_p + (this->filename)._M_string_length);
  }
  if ((this->configHandleMP == false) || (bVar7 = ReadMultipartFile(this), !bVar7)) {
    local_840._0_8_ = local_840 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_840,"rb","");
    iVar8 = (*pIOHandler->_vptr_IOSystem[4])(pIOHandler,(pFile->_M_dataplus)._M_p,local_840._0_8_);
    plVar21 = (long *)CONCAT44(extraout_var,iVar8);
    if ((undefined1 *)local_840._0_8_ != local_840 + 0x10) {
      operator_delete((void *)local_840._0_8_,local_830[0]._M_allocated_capacity + 1);
    }
    if (plVar21 == (long *)0x0) {
      prVar22 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_438,
                     "Failed to open MD3 file ",pFile);
      plVar21 = (long *)std::__cxx11::string::append(local_438);
      local_840._0_8_ = *plVar21;
      pp_Var25 = (_func_int **)(plVar21 + 2);
      if ((_func_int **)local_840._0_8_ == pp_Var25) {
        local_830[0]._0_8_ = *pp_Var25;
        local_830[0]._8_8_ = plVar21[3];
        local_840._0_8_ = local_840 + 0x10;
      }
      else {
        local_830[0]._0_8_ = *pp_Var25;
      }
      local_840._8_8_ = plVar21[1];
      *plVar21 = (long)pp_Var25;
      plVar21[1] = 0;
      *(undefined1 *)(plVar21 + 2) = 0;
      std::runtime_error::runtime_error(prVar22,(string *)local_840);
      *(undefined ***)prVar22 = &PTR__runtime_error_0082bce0;
      __cxa_throw(prVar22,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    uVar9 = (**(code **)(*plVar21 + 0x30))(plVar21);
    this->fileSize = uVar9;
    if ((uVar9 & 0xfffffffc) < 0x6c) {
      prVar22 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_840._0_8_ = local_840 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_840,"MD3 File is too small.","");
      std::runtime_error::runtime_error(prVar22,(string *)local_840);
      *(undefined ***)prVar22 = &PTR__runtime_error_0082bce0;
      __cxa_throw(prVar22,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&local_898,(ulong)uVar9,(allocator_type *)local_840);
    (**(code **)(*plVar21 + 0x10))
              (plVar21,local_898.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start,1,this->fileSize);
    this->mBuffer =
         local_898.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
    this->pcHeader =
         (Header *)
         local_898.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
    ValidateHeaderOffsets(this);
    pHVar5 = this->pcHeader;
    local_8f8 = this->mBuffer;
    uVar9 = pHVar5->OFS_SURFACES;
    uVar2 = pHVar5->NUM_SURFACES;
    local_880 = (ulong)pHVar5->OFS_TAGS;
    pScene->mNumMeshes = uVar2;
    uVar3 = this->pcHeader->NUM_SURFACES;
    if (uVar3 == 0) {
      prVar22 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_840._0_8_ = local_840 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_840,"MD3: No surfaces","");
      std::runtime_error::runtime_error(prVar22,(string *)local_840);
      *(undefined ***)prVar22 = &PTR__runtime_error_0082bce0;
      __cxa_throw(prVar22,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    if (0x31f38 < uVar3) {
      prVar22 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_840._0_8_ = local_840 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_840,"MD3: Too many surfaces, would run out of memory","");
      std::runtime_error::runtime_error(prVar22,(string *)local_840);
      *(undefined ***)prVar22 = &PTR__runtime_error_0082bce0;
      __cxa_throw(prVar22,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    uVar26 = (ulong)uVar2 << 3;
    __s_00 = (aiMesh **)operator_new__(uVar26);
    pScene->mMeshes = __s_00;
    uVar2 = this->pcHeader->NUM_SURFACES;
    pScene->mNumMaterials = uVar2;
    __s_01 = (aiMaterial **)operator_new__(uVar26);
    pScene->mMaterials = __s_01;
    memset(__s_00,0,uVar26);
    memset(__s_01,0,(ulong)uVar2 << 3);
    local_910._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_910;
    local_910._M_impl._M_node._M_size = 0;
    local_910._M_impl._M_node.super__List_node_base._M_prev =
         local_910._M_impl._M_node.super__List_node_base._M_next;
    ReadSkin(this,(SkinData *)local_910._M_impl._M_node.super__List_node_base._M_next);
    local_928._M_impl._M_node._M_size = 0;
    pMVar29 = this;
    local_928._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_928;
    local_928._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_928;
    ReadShader(this,(ShaderData *)&local_928);
    pcVar35 = this->pcHeader->NAME;
    for (p_Var32 = local_928._M_impl._M_node.super__List_node_base._M_next;
        p_Var32 != (_List_node_base *)&local_928;
        p_Var32 = (((list<Assimp::Q3Shader::ShaderDataBlock,_std::allocator<Assimp::Q3Shader::ShaderDataBlock>_>
                     *)&p_Var32->_M_next)->
                  super__List_base<Assimp::Q3Shader::ShaderDataBlock,_std::allocator<Assimp::Q3Shader::ShaderDataBlock>_>
                  )._M_impl._M_node.super__List_node_base._M_next) {
      ConvertPath(pMVar29,(char *)p_Var32[1]._M_next,pcVar35,(string *)(p_Var32 + 1));
      p_Var36 = (_List_node_base *)&p_Var32[3]._M_prev;
      while (p_Var36 = p_Var36->_M_next, p_Var36 != (_List_node_base *)&p_Var32[3]._M_prev) {
        ConvertPath(pMVar29,(char *)p_Var36[1]._M_next,pcVar35,(string *)(p_Var36 + 1));
      }
    }
    local_990 = (ulong)this->pcHeader->NUM_SURFACES;
    if (local_990 == 0) {
      local_9cc = 0;
    }
    else {
      pcSurf = (Surface *)(local_8f8 + uVar9);
      local_878 = &this->configSkinFile;
      local_9cc = 0;
      local_870 = pcVar35;
      do {
        ValidateSurfaceHeaderOffsets(this,pcSurf);
        if ((pcSurf->NUM_VERTICES == 0) || (pcSurf->NUM_TRIANGLES == 0)) {
          iVar8 = pcSurf->OFS_END;
          pScene->mNumMeshes = pScene->mNumMeshes - 1;
        }
        else {
          local_8e8 = (char *)(ulong)pcSurf->OFS_XYZNORMAL;
          local_980 = (char *)(ulong)pcSurf->OFS_TRIANGLES;
          uVar9 = pcSurf->OFS_SHADERS;
          local_8f0 = (char *)(ulong)pcSurf->OFS_ST;
          paVar11 = (aiMesh *)operator_new(0x520);
          paVar11->mPrimitiveTypes = 0;
          paVar11->mNumVertices = 0;
          paVar11->mNumFaces = 0;
          pMVar29 = (MD3Importer *)((paVar11->mName).data + 1);
          memset(&paVar11->mVertices,0,0xcc);
          paVar11->mBones = (aiBone **)0x0;
          paVar11->mMaterialIndex = 0;
          (paVar11->mName).length = 0;
          (paVar11->mName).data[0] = '\0';
          memset(pMVar29,0x1b,0x3ff);
          paVar11->mNumAnimMeshes = 0;
          paVar11->mAnimMeshes = (aiAnimMesh **)0x0;
          paVar11->mMethod = 0;
          (paVar11->mAABB).mMin.x = 0.0;
          (paVar11->mAABB).mMin.y = 0.0;
          (paVar11->mAABB).mMin.z = 0.0;
          (paVar11->mAABB).mMax.x = 0.0;
          (paVar11->mAABB).mMax.y = 0.0;
          (paVar11->mAABB).mMax.z = 0.0;
          paVar11->mTextureCoords[0] = (aiVector3D *)0x0;
          paVar11->mTextureCoords[1] = (aiVector3D *)0x0;
          paVar11->mTextureCoords[2] = (aiVector3D *)0x0;
          paVar11->mTextureCoords[3] = (aiVector3D *)0x0;
          paVar11->mTextureCoords[4] = (aiVector3D *)0x0;
          paVar11->mTextureCoords[5] = (aiVector3D *)0x0;
          paVar11->mTextureCoords[6] = (aiVector3D *)0x0;
          paVar11->mTextureCoords[7] = (aiVector3D *)0x0;
          paVar11->mNumUVComponents[0] = 0;
          paVar11->mNumUVComponents[1] = 0;
          paVar11->mNumUVComponents[2] = 0;
          paVar11->mNumUVComponents[3] = 0;
          paVar11->mNumUVComponents[4] = 0;
          paVar11->mNumUVComponents[5] = 0;
          paVar11->mNumUVComponents[6] = 0;
          paVar11->mNumUVComponents[7] = 0;
          paVar11->mColors[0] = (aiColor4D *)0x0;
          paVar11->mColors[1] = (aiColor4D *)0x0;
          paVar11->mColors[2] = (aiColor4D *)0x0;
          paVar11->mColors[3] = (aiColor4D *)0x0;
          paVar11->mColors[4] = (aiColor4D *)0x0;
          paVar11->mColors[5] = (aiColor4D *)0x0;
          paVar11->mColors[6] = (aiColor4D *)0x0;
          paVar11->mColors[7] = (aiColor4D *)0x0;
          pScene->mMeshes[local_990 - 1] = paVar11;
          paVar11 = pScene->mMeshes[local_990 - 1];
          local_8b8 = &local_8a8;
          local_8b0 = 0;
          local_8a8 = '\0';
          __s = pcSurf->NAME;
          local_840._0_8_ = __s;
          for (__it._M_node = local_910._M_impl._M_node.super__List_node_base._M_next;
              __it._M_node != (_List_node_base *)&local_910; __it._M_node = (__it._M_node)->_M_next)
          {
            pMVar29 = (MD3Importer *)local_840;
            bVar7 = __gnu_cxx::__ops::_Iter_equals_val<char_const[64]>::operator()
                              ((_Iter_equals_val<char_const[64]> *)pMVar29,__it);
            if (bVar7) break;
          }
          if (__it._M_node == (_List_node_base *)&local_910) {
            texture_name = (char *)0x0;
          }
          else {
            std::__cxx11::string::_M_assign((string *)&local_8b8);
            texture_name = local_8b8;
            local_978 = DefaultLogger::get();
            Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
            basic_formatter<char[29]>
                      ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_840,(char (*) [29])"MD3: Assigning skin texture ");
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_840,(char *)__it._M_node[3]._M_next,
                       (long)__it._M_node[3]._M_prev);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_840," to surface ",0xc);
            sVar12 = strlen(__s);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_840,__s,sVar12);
            std::__cxx11::stringbuf::str();
            Logger::debug(local_978,(char *)local_438._0_8_);
            if ((undefined1 *)local_438._0_8_ != local_438 + 0x10) {
              operator_delete((void *)local_438._0_8_,CONCAT44(_uStack_424,local_438._16_4_) + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_840);
            pMVar29 = local_7d0;
            std::ios_base::~ios_base((ios_base *)pMVar29);
            *(undefined1 *)&__it._M_node[5]._M_next = 1;
          }
          if (texture_name == (char *)0x0) {
            texture_name = (char *)0x0;
            if (pcSurf->NUM_SHADER != 0) {
              texture_name = pcSurf->NAME + ((ulong)uVar9 - 4);
            }
          }
          local_970._M_dataplus._M_p = (pointer)&local_970.field_2;
          local_970._M_string_length = 0;
          local_970.field_2._M_local_buf[0] = '\0';
          if (texture_name != (char *)0x0) {
            ConvertPath(pMVar29,texture_name,pcVar35,&local_970);
          }
          if (local_928._M_impl._M_node.super__List_node_base._M_next ==
              (_List_node_base *)&local_928) {
            pSVar33 = (ShaderDataBlock *)0x0;
          }
          else {
            std::__cxx11::string::rfind((char)&local_970,0x2e);
            std::__cxx11::string::substr((ulong)local_840,(ulong)&local_970);
            for (p_Var32 = local_928._M_impl._M_node.super__List_node_base._M_next;
                p_Var32 != (_List_node_base *)&local_928; p_Var32 = p_Var32->_M_next) {
              bVar7 = Q3Shader::ShaderDataBlock::operator==
                                ((ShaderDataBlock *)(p_Var32 + 1),(string *)local_840);
              if (bVar7) break;
            }
            if (p_Var32 == (_List_node_base *)&local_928) {
              pLVar13 = DefaultLogger::get();
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_438,"Unable to find shader record for ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_840);
              Logger::warn(pLVar13,(char *)local_438._0_8_);
              if ((undefined1 *)local_438._0_8_ != local_438 + 0x10) {
                operator_delete((void *)local_438._0_8_,CONCAT44(_uStack_424,local_438._16_4_) + 1);
              }
              pSVar33 = (ShaderDataBlock *)0x0;
            }
            else {
              pLVar13 = DefaultLogger::get();
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_438,"Found shader record for ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_840);
              Logger::info(pLVar13,(char *)local_438._0_8_);
              if ((undefined1 *)local_438._0_8_ != local_438 + 0x10) {
                operator_delete((void *)local_438._0_8_,CONCAT44(_uStack_424,local_438._16_4_) + 1);
              }
              pSVar33 = (ShaderDataBlock *)(p_Var32 + 1);
            }
            if ((undefined1 *)local_840._0_8_ != local_840 + 0x10) {
              operator_delete((void *)local_840._0_8_,local_830[0]._M_allocated_capacity + 1);
            }
          }
          this_00 = (aiMaterial *)operator_new(0x10);
          aiMaterial::aiMaterial(this_00);
          local_94c = 2;
          aiMaterial::AddBinaryProperty(this_00,&local_94c,4,"$mat.shadingm",0,0,aiPTI_Integer);
          local_9a4 = 0x3d4ccccd3d4ccccd;
          local_99c = 0x3d4ccccd;
          aiMaterial::AddBinaryProperty(this_00,&local_9a4,0xc,"$clr.ambient",0,0,aiPTI_Float);
          local_9a4 = 0x3f8000003f800000;
          local_99c = 0x3f800000;
          aiMaterial::AddBinaryProperty(this_00,&local_9a4,0xc,"$clr.diffuse",0,0,aiPTI_Float);
          aiMaterial::AddBinaryProperty(this_00,&local_9a4,0xc,"$clr.specular",0,0,aiPTI_Float);
          local_840._0_8_ = local_840._0_8_ & 0xffffff0000000000;
          memset(local_840 + 5,0x1b,0x3ff);
          std::operator+(&local_860,"MD3_[",local_878);
          plVar14 = (long *)std::__cxx11::string::append((char *)&local_860);
          local_8d8 = &local_8c8;
          plVar23 = plVar14 + 2;
          if ((long *)*plVar14 == plVar23) {
            local_8c8 = *plVar23;
            lStack_8c0 = plVar14[3];
          }
          else {
            local_8c8 = *plVar23;
            local_8d8 = (long *)*plVar14;
          }
          local_8d0 = plVar14[1];
          *plVar14 = (long)plVar23;
          plVar14[1] = 0;
          *(undefined1 *)(plVar14 + 2) = 0;
          plVar14 = (long *)std::__cxx11::string::append((char *)&local_8d8);
          local_948 = &local_938;
          plVar23 = plVar14 + 2;
          if ((long *)*plVar14 == plVar23) {
            local_938 = *plVar23;
            lStack_930 = plVar14[3];
          }
          else {
            local_938 = *plVar23;
            local_948 = (long *)*plVar14;
          }
          local_940 = plVar14[1];
          *plVar14 = (long)plVar23;
          plVar14[1] = 0;
          *(undefined1 *)(plVar14 + 2) = 0;
          plVar14 = (long *)std::__cxx11::string::append((char *)&local_948);
          local_438._0_8_ = local_438 + 0x10;
          plVar23 = plVar14 + 2;
          if ((long *)*plVar14 == plVar23) {
            auStack_423._3_8_ = plVar14[3];
            local_438._16_4_ = (undefined4)*plVar23;
            _uStack_424 = (undefined4)((ulong)*plVar23 >> 0x20);
          }
          else {
            local_438._16_4_ = (undefined4)*plVar23;
            _uStack_424 = (undefined4)((ulong)*plVar23 >> 0x20);
            local_438._0_8_ = (long *)*plVar14;
          }
          uVar26 = plVar14[1];
          local_438._8_4_ = (undefined4)uVar26;
          local_438._12_4_ = (undefined4)(uVar26 >> 0x20);
          *plVar14 = (long)plVar23;
          plVar14[1] = 0;
          *(undefined1 *)(plVar14 + 2) = 0;
          if (uVar26 < 0x400) {
            local_840._0_4_ = local_438._8_4_;
            memcpy(local_840 + 4,(void *)local_438._0_8_,uVar26);
            local_840[uVar26 + 4] = 0;
          }
          if ((undefined1 *)local_438._0_8_ != local_438 + 0x10) {
            operator_delete((void *)local_438._0_8_,CONCAT44(_uStack_424,local_438._16_4_) + 1);
          }
          if (local_948 != &local_938) {
            operator_delete(local_948,local_938 + 1);
          }
          local_988 = pSVar33;
          if (local_8d8 != &local_8c8) {
            operator_delete(local_8d8,local_8c8 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_860._M_dataplus._M_p != &local_860.field_2) {
            operator_delete(local_860._M_dataplus._M_p,local_860.field_2._M_allocated_capacity + 1);
          }
          aiMaterial::AddProperty(this_00,(aiString *)local_840,"?mat.name",0,0);
          if (local_988 == (ShaderDataBlock *)0x0) {
            local_438._0_4_ = 0;
            local_438._4_4_ = local_438._4_4_ & 0xffffff00;
            memset(local_438 + 5,0x1b,0x3ff);
            sVar6 = local_970._M_string_length;
            if (local_970._M_string_length == 0) {
              pLVar13 = DefaultLogger::get();
              Logger::warn(pLVar13,"Texture file name has zero length. Using default name");
              local_438._0_4_ = 0x11;
              local_438._4_4_ = 0x6d6d7564;
              local_438[8] = 'y';
              local_438[9] = '_';
              local_438[10] = 't';
              local_438[0xb] = 'e';
              local_438[0xc] = 'x';
              local_438[0xd] = 't';
              local_438[0xe] = 'u';
              local_438[0xf] = 'r';
              local_438._16_4_ = 0x6d622e65;
              uStack_424 = 0x70;
              puVar34 = auStack_423;
LAB_00477eb5:
              *puVar34 = 0;
            }
            else if (local_970._M_string_length < 0x400) {
              local_438._0_4_ = (undefined4)local_970._M_string_length;
              memcpy(local_438 + 4,local_970._M_dataplus._M_p,local_970._M_string_length);
              puVar34 = local_438 + 4 + sVar6;
              goto LAB_00477eb5;
            }
            aiMaterial::AddProperty(this_00,(aiString *)local_438,"$tex.file",1,0);
            local_948 = (long *)CONCAT44(local_948._4_4_,4);
            aiMaterial::AddBinaryProperty(this_00,&local_948,4,"$tex.flags",1,0,aiPTI_Integer);
          }
          else {
            Q3Shader::ConvertShaderToMaterial(this_00,local_988);
          }
          pScene->mMaterials[local_9cc] = this_00;
          paVar11->mMaterialIndex = local_9cc;
          paVar11->mPrimitiveTypes = 4;
          paVar11->mNumVertices = pcSurf->NUM_TRIANGLES * 3;
          paVar11->mNumFaces = pcSurf->NUM_TRIANGLES;
          uVar26 = (ulong)pcSurf->NUM_TRIANGLES;
          puVar15 = (ulong *)operator_new__(uVar26 * 0x10 + 8);
          *puVar15 = uVar26;
          paVar16 = (aiFace *)(puVar15 + 1);
          if (uVar26 != 0) {
            paVar24 = paVar16;
            do {
              paVar24->mNumIndices = 0;
              paVar24->mIndices = (uint *)0x0;
              paVar24 = paVar24 + 1;
            } while (paVar24 != paVar16 + uVar26);
          }
          paVar11->mFaces = paVar16;
          uVar26 = (ulong)paVar11->mNumVertices;
          paVar17 = (aiVector3D *)operator_new__(uVar26 * 0xc);
          if (uVar26 != 0) {
            memset(paVar17,0,((uVar26 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
          }
          paVar11->mNormals = paVar17;
          uVar26 = (ulong)paVar11->mNumVertices;
          paVar17 = (aiVector3D *)operator_new__(uVar26 * 0xc);
          if (uVar26 != 0) {
            memset(paVar17,0,((uVar26 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
          }
          paVar11->mVertices = paVar17;
          uVar26 = (ulong)paVar11->mNumVertices;
          paVar17 = (aiVector3D *)operator_new__(uVar26 * 0xc);
          if (uVar26 != 0) {
            memset(paVar17,0,((uVar26 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
          }
          paVar11->mTextureCoords[0] = paVar17;
          paVar11->mNumUVComponents[0] = 2;
          if (pcSurf->NUM_TRIANGLES != 0) {
            local_8e8 = pcSurf->NAME + (long)(local_8e8 + -4);
            local_980 = pcSurf->NAME + (long)(local_980 + -4);
            local_8f0 = pcSurf->NAME + (long)(local_8f0 + -4);
            uVar26 = 0;
            local_998 = 0;
            do {
              puVar18 = (uint *)operator_new__(0xc);
              local_8e0 = uVar26 * 0x10;
              paVar11->mFaces[uVar26].mIndices = puVar18;
              paVar11->mFaces[uVar26].mNumIndices = 3;
              local_998 = local_998 & 0xffffffff;
              lVar27 = 0;
              local_868 = uVar26;
              do {
                uVar9 = (int)local_998 + (int)lVar27;
                *(uint *)(*(long *)((long)&paVar11->mFaces->mIndices + local_8e0) + lVar27 * 4) =
                     uVar9;
                uVar26 = (ulong)*(uint *)(local_980 + lVar27 * 4);
                if (pcSurf->NUM_VERTICES <= *(uint *)(local_980 + lVar27 * 4)) {
                  prVar22 = (runtime_error *)__cxa_allocate_exception(0x10);
                  local_438._0_8_ = local_438 + 0x10;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_438,"MD3: Invalid vertex index","");
                  std::runtime_error::runtime_error(prVar22,(string *)local_438);
                  *(undefined ***)prVar22 = &PTR__runtime_error_0082bce0;
                  __cxa_throw(prVar22,&DeadlyImportError::typeinfo,
                              std::runtime_error::~runtime_error);
                }
                paVar17 = paVar11->mVertices;
                paVar17[uVar9].x = (float)(int)*(short *)(local_8e8 + uVar26 * 8) * 0.015625;
                paVar17[uVar9].y = (float)(int)*(short *)(local_8e8 + uVar26 * 8 + 2) * 0.015625;
                paVar17[uVar9].z = (float)(int)*(short *)(local_8e8 + uVar26 * 8 + 4) * 0.015625;
                paVar17 = paVar11->mNormals;
                fVar38 = (float)(*(ushort *)(local_8e8 + uVar26 * 8 + 6) >> 8) * 0.024546297;
                __x = (float)(byte)*(ushort *)(local_8e8 + uVar26 * 8 + 6) * 0.024546297;
                fVar37 = cosf(fVar38);
                local_978 = (Logger *)CONCAT44(local_978._4_4_,fVar37);
                fVar37 = sinf(__x);
                paVar17[uVar9].x = fVar37 * local_978._0_4_;
                fVar37 = sinf(fVar38);
                fVar38 = sinf(__x);
                paVar17[uVar9].y = fVar38 * fVar37;
                fVar37 = cosf(__x);
                paVar17[uVar9].z = fVar37;
                paVar11->mTextureCoords[0][uVar9].x = *(float *)(local_8f0 + uVar26 * 8);
                paVar11->mTextureCoords[0][uVar9].y = 1.0 - *(float *)(local_8f0 + uVar26 * 8 + 4);
                lVar27 = lVar27 + 1;
              } while (lVar27 != 3);
              if ((local_988 == (ShaderDataBlock *)0x0) || (local_988->cull == CULL_CW)) {
                lVar27 = *(long *)((long)&paVar11->mFaces->mIndices + local_8e0);
                uVar4 = *(undefined4 *)(lVar27 + 8);
                *(undefined4 *)(lVar27 + 8) = *(undefined4 *)(lVar27 + 4);
                *(undefined4 *)(lVar27 + 4) = uVar4;
              }
              local_998 = local_998 + 3;
              local_980 = local_980 + 0xc;
              uVar26 = local_868 + 1;
              pcVar35 = local_870;
            } while (uVar26 < pcSurf->NUM_TRIANGLES);
          }
          iVar8 = pcSurf->OFS_END;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_970._M_dataplus._M_p != &local_970.field_2) {
            operator_delete(local_970._M_dataplus._M_p,
                            CONCAT71(local_970.field_2._M_allocated_capacity._1_7_,
                                     local_970.field_2._M_local_buf[0]) + 1);
          }
          if (local_8b8 != &local_8a8) {
            operator_delete(local_8b8,CONCAT71(uStack_8a7,local_8a8) + 1);
          }
          local_9cc = local_9cc + 1;
        }
        local_990 = local_990 - 1;
        pcSurf = (Surface *)(pcSurf->NAME + (long)iVar8 + -4);
      } while (local_990 != 0);
    }
    local_990 = 0;
    bVar7 = DefaultLogger::isNullLogger();
    if ((!bVar7) &&
       (local_910._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_910)) {
      p_Var32 = local_910._M_impl._M_node.super__List_node_base._M_next;
      do {
        if (*(char *)&p_Var32[5]._M_next == '\0') {
          pLVar13 = DefaultLogger::get();
          Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
          basic_formatter<char[27]>
                    ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_840,(char (*) [27])"MD3: Failed to match skin ");
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_840,(char *)p_Var32[1]._M_next,(long)p_Var32[1]._M_prev);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_840," to surface ",0xc);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_840,
                     (char *)(((list<Assimp::Q3Shader::SkinData::TextureEntry,_std::allocator<Assimp::Q3Shader::SkinData::TextureEntry>_>
                                *)&p_Var32[3]._M_next)->
                             super__List_base<Assimp::Q3Shader::SkinData::TextureEntry,_std::allocator<Assimp::Q3Shader::SkinData::TextureEntry>_>
                             )._M_impl._M_node.super__List_node_base._M_next,
                     (long)p_Var32[3]._M_prev);
          std::__cxx11::stringbuf::str();
          Logger::error(pLVar13,(char *)local_438._0_8_);
          if ((undefined1 *)local_438._0_8_ != local_438 + 0x10) {
            operator_delete((void *)local_438._0_8_,CONCAT44(_uStack_424,local_438._16_4_) + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_840);
          std::ios_base::~ios_base((ios_base *)local_7d0);
        }
        p_Var32 = (((list<Assimp::Q3Shader::SkinData::TextureEntry,_std::allocator<Assimp::Q3Shader::SkinData::TextureEntry>_>
                     *)&p_Var32->_M_next)->
                  super__List_base<Assimp::Q3Shader::SkinData::TextureEntry,_std::allocator<Assimp::Q3Shader::SkinData::TextureEntry>_>
                  )._M_impl._M_node.super__List_node_base._M_next;
      } while (p_Var32 != (_List_node_base *)&local_910);
    }
    if (pScene->mNumMeshes == 0) {
      prVar22 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_840._0_8_ = local_840 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_840,"MD3: File contains no valid mesh","");
      std::runtime_error::runtime_error(prVar22,(string *)local_840);
      *(undefined ***)prVar22 = &PTR__runtime_error_0082bce0;
      __cxa_throw(prVar22,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    pScene->mNumMaterials = local_9cc;
    paVar19 = (aiNode *)operator_new(0x478);
    local_840._0_8_ = local_840 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_840,"<MD3Root>","");
    aiNode::aiNode(paVar19,(string *)local_840);
    pScene->mRootNode = paVar19;
    if ((undefined1 *)local_840._0_8_ != local_840 + 0x10) {
      operator_delete((void *)local_840._0_8_,local_830[0]._M_allocated_capacity + 1);
    }
    pScene->mRootNode->mNumMeshes = pScene->mNumMeshes;
    puVar18 = (uint *)operator_new__((ulong)pScene->mNumMeshes << 2);
    pScene->mRootNode->mMeshes = puVar18;
    uVar9 = this->pcHeader->NUM_TAGS;
    if (uVar9 != 0) {
      pScene->mRootNode->mNumChildren = uVar9;
      ppaVar20 = (aiNode **)operator_new__((ulong)this->pcHeader->NUM_TAGS << 3);
      pScene->mRootNode->mChildren = ppaVar20;
      if (this->pcHeader->NUM_TAGS != 0) {
        __s_02 = local_8f8 + local_880;
        local_9e0 = (float *)(local_8f8 + local_880 + 0x4c);
        uVar26 = 0;
        do {
          paVar19 = (aiNode *)operator_new(0x478);
          aiNode::aiNode(paVar19);
          pScene->mRootNode->mChildren[uVar26] = paVar19;
          sVar12 = strlen((char *)__s_02);
          aVar10 = (ai_uint32)sVar12;
          if ((int)aVar10 < 0x400) {
            (paVar19->mName).length = aVar10;
            memcpy((paVar19->mName).data,__s_02,(long)(int)aVar10);
            (paVar19->mName).data[(int)aVar10] = '\0';
          }
          paVar19->mParent = pScene->mRootNode;
          (paVar19->mTransformation).a4 = *(float *)(__s_02 + 0x40);
          (paVar19->mTransformation).b4 = *(float *)(__s_02 + 0x44);
          (paVar19->mTransformation).c4 = *(float *)(__s_02 + 0x48);
          lVar27 = 0;
          pfVar28 = local_9e0;
          do {
            fVar37 = *pfVar28;
            lVar30 = 0;
            paVar31 = &paVar19->mTransformation;
            while( true ) {
              (&paVar31->a1)[lVar27] = fVar37;
              lVar30 = lVar30 + 1;
              if (lVar30 == 3) break;
              fVar37 = pfVar28[lVar30];
              paVar31 = (aiMatrix4x4 *)&(paVar19->mTransformation).b1;
            }
            lVar27 = lVar27 + 1;
            pfVar28 = pfVar28 + 3;
          } while (lVar27 != 3);
          uVar26 = uVar26 + 1;
          __s_02 = __s_02 + 0x70;
          local_9e0 = local_9e0 + 0x1c;
        } while (uVar26 < this->pcHeader->NUM_TAGS);
      }
    }
    if (pScene->mNumMeshes != 0) {
      uVar26 = 0;
      do {
        pScene->mRootNode->mMeshes[uVar26] = (uint)uVar26;
        uVar26 = uVar26 + 1;
      } while (uVar26 < pScene->mNumMeshes);
    }
    paVar19 = pScene->mRootNode;
    (paVar19->mTransformation).a1 = 1.0;
    (paVar19->mTransformation).a2 = 0.0;
    (paVar19->mTransformation).a3 = 0.0;
    (paVar19->mTransformation).a4 = 0.0;
    (paVar19->mTransformation).b1 = 0.0;
    (paVar19->mTransformation).b2 = 0.0;
    (paVar19->mTransformation).b3 = 1.0;
    (paVar19->mTransformation).b4 = 0.0;
    (paVar19->mTransformation).c1 = 0.0;
    (paVar19->mTransformation).c2 = -1.0;
    (paVar19->mTransformation).c3 = 0.0;
    (paVar19->mTransformation).c4 = 0.0;
    (paVar19->mTransformation).d1 = 0.0;
    (paVar19->mTransformation).d2 = 0.0;
    (paVar19->mTransformation).d3 = 0.0;
    (paVar19->mTransformation).d4 = 1.0;
    std::__cxx11::
    _List_base<Assimp::Q3Shader::ShaderDataBlock,_std::allocator<Assimp::Q3Shader::ShaderDataBlock>_>
    ::_M_clear(&local_928);
    std::__cxx11::
    _List_base<Assimp::Q3Shader::SkinData::TextureEntry,_std::allocator<Assimp::Q3Shader::SkinData::TextureEntry>_>
    ::_M_clear(&local_910);
    if ((Header *)
        local_898.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (Header *)0x0) {
      operator_delete(local_898.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_898.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_898.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    (**(code **)(*plVar21 + 8))();
  }
  return;
}

Assistant:

void MD3Importer::InternReadFile( const std::string& pFile, aiScene* pScene, IOSystem* pIOHandler) {
    mFile = pFile;
    mScene = pScene;
    mIOHandler = pIOHandler;

    // get base path and file name
    // todo ... move to PathConverter
    std::string::size_type s = mFile.find_last_of("/\\");
    if (s == std::string::npos) {
        s = 0;
    } else {
        ++s;
    }
    filename = mFile.substr(s), path = mFile.substr(0, s);
    for (std::string::iterator it = filename.begin(); it != filename.end(); ++it) {
        *it = static_cast<char>( tolower(*it) );
    }

    // Load multi-part model file, if necessary
    if (configHandleMP) {
        if (ReadMultipartFile())
            return;
    }

    std::unique_ptr<IOStream> file( pIOHandler->Open( pFile));

    // Check whether we can read from the file
    if( file.get() == NULL)
        throw DeadlyImportError( "Failed to open MD3 file " + pFile + ".");

    // Check whether the md3 file is large enough to contain the header
    fileSize = (unsigned int)file->FileSize();
    if( fileSize < sizeof(MD3::Header))
        throw DeadlyImportError( "MD3 File is too small.");

    // Allocate storage and copy the contents of the file to a memory buffer
    std::vector<unsigned char> mBuffer2 (fileSize);
    file->Read( &mBuffer2[0], 1, fileSize);
    mBuffer = &mBuffer2[0];

    pcHeader = (BE_NCONST MD3::Header*)mBuffer;

    // Ensure correct endianness
#ifdef AI_BUILD_BIG_ENDIAN

    AI_SWAP4(pcHeader->VERSION);
    AI_SWAP4(pcHeader->FLAGS);
    AI_SWAP4(pcHeader->IDENT);
    AI_SWAP4(pcHeader->NUM_FRAMES);
    AI_SWAP4(pcHeader->NUM_SKINS);
    AI_SWAP4(pcHeader->NUM_SURFACES);
    AI_SWAP4(pcHeader->NUM_TAGS);
    AI_SWAP4(pcHeader->OFS_EOF);
    AI_SWAP4(pcHeader->OFS_FRAMES);
    AI_SWAP4(pcHeader->OFS_SURFACES);
    AI_SWAP4(pcHeader->OFS_TAGS);

#endif

    // Validate the file header
    ValidateHeaderOffsets();

    // Navigate to the list of surfaces
    BE_NCONST MD3::Surface* pcSurfaces = (BE_NCONST MD3::Surface*)(mBuffer + pcHeader->OFS_SURFACES);

    // Navigate to the list of tags
    BE_NCONST MD3::Tag* pcTags = (BE_NCONST MD3::Tag*)(mBuffer + pcHeader->OFS_TAGS);

    // Allocate output storage
    pScene->mNumMeshes = pcHeader->NUM_SURFACES;
    if (pcHeader->NUM_SURFACES == 0) {
        throw DeadlyImportError("MD3: No surfaces");
    } else if (pcHeader->NUM_SURFACES > AI_MAX_ALLOC(aiMesh)) {
        // We allocate pointers but check against the size of aiMesh
        // since those pointers will eventually have to point to real objects
        throw DeadlyImportError("MD3: Too many surfaces, would run out of memory");
    }
    pScene->mMeshes = new aiMesh*[pScene->mNumMeshes];

    pScene->mNumMaterials = pcHeader->NUM_SURFACES;
    pScene->mMaterials = new aiMaterial*[pScene->mNumMeshes];

    // Set arrays to zero to ensue proper destruction if an exception is raised
    ::memset(pScene->mMeshes,0,pScene->mNumMeshes*sizeof(aiMesh*));
    ::memset(pScene->mMaterials,0,pScene->mNumMaterials*sizeof(aiMaterial*));

    // Now read possible skins from .skin file
    Q3Shader::SkinData skins;
    ReadSkin(skins);

    // And check whether we can locate a shader file for this model
    Q3Shader::ShaderData shaders;
    ReadShader(shaders);

    // Adjust all texture paths in the shader
    const char* header_name = pcHeader->NAME;
    if (!shaders.blocks.empty()) {
        for (std::list< Q3Shader::ShaderDataBlock >::iterator dit = shaders.blocks.begin(); dit != shaders.blocks.end(); ++dit) {
            ConvertPath((*dit).name.c_str(),header_name,(*dit).name);

            for (std::list< Q3Shader::ShaderMapBlock >::iterator mit = (*dit).maps.begin(); mit != (*dit).maps.end(); ++mit) {
                ConvertPath((*mit).name.c_str(),header_name,(*mit).name);
            }
        }
    }

    // Read all surfaces from the file
    unsigned int iNum = pcHeader->NUM_SURFACES;
    unsigned int iNumMaterials = 0;
    while (iNum-- > 0)  {

        // Ensure correct endianness
#ifdef AI_BUILD_BIG_ENDIAN

        AI_SWAP4(pcSurfaces->FLAGS);
        AI_SWAP4(pcSurfaces->IDENT);
        AI_SWAP4(pcSurfaces->NUM_FRAMES);
        AI_SWAP4(pcSurfaces->NUM_SHADER);
        AI_SWAP4(pcSurfaces->NUM_TRIANGLES);
        AI_SWAP4(pcSurfaces->NUM_VERTICES);
        AI_SWAP4(pcSurfaces->OFS_END);
        AI_SWAP4(pcSurfaces->OFS_SHADERS);
        AI_SWAP4(pcSurfaces->OFS_ST);
        AI_SWAP4(pcSurfaces->OFS_TRIANGLES);
        AI_SWAP4(pcSurfaces->OFS_XYZNORMAL);

#endif

        // Validate the surface header
        ValidateSurfaceHeaderOffsets(pcSurfaces);

        // Navigate to the vertex list of the surface
        BE_NCONST MD3::Vertex* pcVertices = (BE_NCONST MD3::Vertex*)
            (((uint8_t*)pcSurfaces) + pcSurfaces->OFS_XYZNORMAL);

        // Navigate to the triangle list of the surface
        BE_NCONST MD3::Triangle* pcTriangles = (BE_NCONST MD3::Triangle*)
            (((uint8_t*)pcSurfaces) + pcSurfaces->OFS_TRIANGLES);

        // Navigate to the texture coordinate list of the surface
        BE_NCONST MD3::TexCoord* pcUVs = (BE_NCONST MD3::TexCoord*)
            (((uint8_t*)pcSurfaces) + pcSurfaces->OFS_ST);

        // Navigate to the shader list of the surface
        BE_NCONST MD3::Shader* pcShaders = (BE_NCONST MD3::Shader*)
            (((uint8_t*)pcSurfaces) + pcSurfaces->OFS_SHADERS);

        // If the submesh is empty ignore it
        if (0 == pcSurfaces->NUM_VERTICES || 0 == pcSurfaces->NUM_TRIANGLES)
        {
            pcSurfaces = (BE_NCONST MD3::Surface*)(((uint8_t*)pcSurfaces) + pcSurfaces->OFS_END);
            pScene->mNumMeshes--;
            continue;
        }

        // Allocate output mesh
        pScene->mMeshes[iNum] = new aiMesh();
        aiMesh* pcMesh = pScene->mMeshes[iNum];

        std::string _texture_name;
        const char* texture_name = NULL;

        // Check whether we have a texture record for this surface in the .skin file
        std::list< Q3Shader::SkinData::TextureEntry >::iterator it = std::find(
            skins.textures.begin(), skins.textures.end(), pcSurfaces->NAME );

        if (it != skins.textures.end()) {
            texture_name = &*( _texture_name = (*it).second).begin();
            ASSIMP_LOG_DEBUG_F("MD3: Assigning skin texture ", (*it).second, " to surface ", pcSurfaces->NAME);
            (*it).resolved = true; // mark entry as resolved
        }

        // Get the first shader (= texture?) assigned to the surface
        if (!texture_name && pcSurfaces->NUM_SHADER)    {
            texture_name = pcShaders->NAME;
        }

        std::string convertedPath;
        if (texture_name) {
            ConvertPath(texture_name,header_name,convertedPath);
        }

        const Q3Shader::ShaderDataBlock* shader = NULL;

        // Now search the current shader for a record with this name (
        // excluding texture file extension)
        if (!shaders.blocks.empty()) {
            std::string::size_type sh = convertedPath.find_last_of('.');
            if (sh == std::string::npos) {
                sh = convertedPath.length();
            }

            const std::string without_ext = convertedPath.substr(0,sh);
            std::list< Q3Shader::ShaderDataBlock >::const_iterator dit = std::find(shaders.blocks.begin(),shaders.blocks.end(),without_ext);
            if (dit != shaders.blocks.end()) {
                // We made it!
                shader = &*dit;
                ASSIMP_LOG_INFO("Found shader record for " +without_ext );
            } else {
                ASSIMP_LOG_WARN("Unable to find shader record for " + without_ext);
            }
        }

        aiMaterial* pcHelper = new aiMaterial();

        const int iMode = (int)aiShadingMode_Gouraud;
        pcHelper->AddProperty<int>(&iMode, 1, AI_MATKEY_SHADING_MODEL);

        // Add a small ambient color value - Quake 3 seems to have one
        aiColor3D clr;
        clr.b = clr.g = clr.r = 0.05f;
        pcHelper->AddProperty<aiColor3D>(&clr, 1,AI_MATKEY_COLOR_AMBIENT);

        clr.b = clr.g = clr.r = 1.0f;
        pcHelper->AddProperty<aiColor3D>(&clr, 1,AI_MATKEY_COLOR_DIFFUSE);
        pcHelper->AddProperty<aiColor3D>(&clr, 1,AI_MATKEY_COLOR_SPECULAR);

        // use surface name + skin_name as material name
        aiString name;
        name.Set("MD3_[" + configSkinFile + "][" + pcSurfaces->NAME + "]");
        pcHelper->AddProperty(&name,AI_MATKEY_NAME);

        if (!shader) {
            // Setup dummy texture file name to ensure UV coordinates are kept during postprocessing
            aiString szString;
            if (convertedPath.length()) {
                szString.Set(convertedPath);
            } else    {
                ASSIMP_LOG_WARN("Texture file name has zero length. Using default name");
                szString.Set("dummy_texture.bmp");
            }
            pcHelper->AddProperty(&szString,AI_MATKEY_TEXTURE_DIFFUSE(0));

            // prevent transparency by default
            int no_alpha = aiTextureFlags_IgnoreAlpha;
            pcHelper->AddProperty(&no_alpha,1,AI_MATKEY_TEXFLAGS_DIFFUSE(0));
        } else {
            Q3Shader::ConvertShaderToMaterial(pcHelper,*shader);
        }

        pScene->mMaterials[iNumMaterials] = (aiMaterial*)pcHelper;
        pcMesh->mMaterialIndex = iNumMaterials++;

            // Ensure correct endianness
#ifdef AI_BUILD_BIG_ENDIAN

        for (uint32_t i = 0; i < pcSurfaces->NUM_VERTICES;++i)  {
            AI_SWAP2( pcVertices[i].NORMAL );
            AI_SWAP2( pcVertices[i].X );
            AI_SWAP2( pcVertices[i].Y );
            AI_SWAP2( pcVertices[i].Z );

            AI_SWAP4( pcUVs[i].U );
            AI_SWAP4( pcUVs[i].V );
        }
        for (uint32_t i = 0; i < pcSurfaces->NUM_TRIANGLES;++i) {
            AI_SWAP4(pcTriangles[i].INDEXES[0]);
            AI_SWAP4(pcTriangles[i].INDEXES[1]);
            AI_SWAP4(pcTriangles[i].INDEXES[2]);
        }

#endif

        // Fill mesh information
        pcMesh->mPrimitiveTypes = aiPrimitiveType_TRIANGLE;

        pcMesh->mNumVertices        = pcSurfaces->NUM_TRIANGLES*3;
        pcMesh->mNumFaces           = pcSurfaces->NUM_TRIANGLES;
        pcMesh->mFaces              = new aiFace[pcSurfaces->NUM_TRIANGLES];
        pcMesh->mNormals            = new aiVector3D[pcMesh->mNumVertices];
        pcMesh->mVertices           = new aiVector3D[pcMesh->mNumVertices];
        pcMesh->mTextureCoords[0]   = new aiVector3D[pcMesh->mNumVertices];
        pcMesh->mNumUVComponents[0] = 2;

        // Fill in all triangles
        unsigned int iCurrent = 0;
        for (unsigned int i = 0; i < (unsigned int)pcSurfaces->NUM_TRIANGLES;++i)   {
            pcMesh->mFaces[i].mIndices = new unsigned int[3];
            pcMesh->mFaces[i].mNumIndices = 3;

            //unsigned int iTemp = iCurrent;
            for (unsigned int c = 0; c < 3;++c,++iCurrent)  {
                pcMesh->mFaces[i].mIndices[c] = iCurrent;

                // Read vertices
                aiVector3D& vec = pcMesh->mVertices[iCurrent];
                uint32_t index = pcTriangles->INDEXES[c];
                if (index >= pcSurfaces->NUM_VERTICES) {
                    throw DeadlyImportError( "MD3: Invalid vertex index");
                }
                vec.x = pcVertices[index].X*AI_MD3_XYZ_SCALE;
                vec.y = pcVertices[index].Y*AI_MD3_XYZ_SCALE;
                vec.z = pcVertices[index].Z*AI_MD3_XYZ_SCALE;

                // Convert the normal vector to uncompressed float3 format
                aiVector3D& nor = pcMesh->mNormals[iCurrent];
                LatLngNormalToVec3(pcVertices[index].NORMAL,(ai_real*)&nor);

                // Read texture coordinates
                pcMesh->mTextureCoords[0][iCurrent].x = pcUVs[index].U;
                pcMesh->mTextureCoords[0][iCurrent].y = 1.0f-pcUVs[index].V;
            }
            // Flip face order if necessary
            if (!shader || shader->cull == Q3Shader::CULL_CW) {
                std::swap(pcMesh->mFaces[i].mIndices[2],pcMesh->mFaces[i].mIndices[1]);
            }
            ++pcTriangles;
        }

        // Go to the next surface
        pcSurfaces = (BE_NCONST MD3::Surface*)(((unsigned char*)pcSurfaces) + pcSurfaces->OFS_END);
    }

    // For debugging purposes: check whether we found matches for all entries in the skins file
    if (!DefaultLogger::isNullLogger()) {
        for (std::list< Q3Shader::SkinData::TextureEntry>::const_iterator it = skins.textures.begin();it != skins.textures.end(); ++it) {
            if (!(*it).resolved) {
                ASSIMP_LOG_ERROR_F("MD3: Failed to match skin ", (*it).first, " to surface ", (*it).second);
            }
        }
    }

    if (!pScene->mNumMeshes) {
        throw DeadlyImportError( "MD3: File contains no valid mesh");
    }
    pScene->mNumMaterials = iNumMaterials;

    // Now we need to generate an empty node graph
    pScene->mRootNode = new aiNode("<MD3Root>");
    pScene->mRootNode->mNumMeshes = pScene->mNumMeshes;
    pScene->mRootNode->mMeshes = new unsigned int[pScene->mNumMeshes];

    // Attach tiny children for all tags
    if (pcHeader->NUM_TAGS) {
        pScene->mRootNode->mNumChildren = pcHeader->NUM_TAGS;
        pScene->mRootNode->mChildren = new aiNode*[pcHeader->NUM_TAGS];

        for (unsigned int i = 0; i < pcHeader->NUM_TAGS; ++i, ++pcTags) {
            aiNode* nd = pScene->mRootNode->mChildren[i] = new aiNode();
            nd->mName.Set((const char*)pcTags->NAME);
            nd->mParent = pScene->mRootNode;

            AI_SWAP4(pcTags->origin.x);
            AI_SWAP4(pcTags->origin.y);
            AI_SWAP4(pcTags->origin.z);

            // Copy local origin, again flip z,y
            nd->mTransformation.a4 = pcTags->origin.x;
            nd->mTransformation.b4 = pcTags->origin.y;
            nd->mTransformation.c4 = pcTags->origin.z;

            // Copy rest of transformation (need to transpose to match row-order matrix)
            for (unsigned int a = 0; a < 3;++a) {
                for (unsigned int m = 0; m < 3;++m) {
                    nd->mTransformation[m][a] = pcTags->orientation[a][m];
                    AI_SWAP4(nd->mTransformation[m][a]);
                }
            }
        }
    }

    for (unsigned int i = 0; i < pScene->mNumMeshes;++i)
        pScene->mRootNode->mMeshes[i] = i;

    // Now rotate the whole scene 90 degrees around the x axis to convert to internal coordinate system
    pScene->mRootNode->mTransformation = aiMatrix4x4(
        1.f,0.f,0.f,0.f,
        0.f,0.f,1.f,0.f,
        0.f,-1.f,0.f,0.f,
        0.f,0.f,0.f,1.f
    );
}